

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall TEST_SimpleString_Binary_Test::testBody(TEST_SimpleString_Binary_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50 [2];
  SimpleString local_30;
  undefined8 local_20;
  char expectedString [12];
  uchar value [4];
  TEST_SimpleString_Binary_Test *this_local;
  
  expectedString[4] = '\0';
  expectedString[5] = '\x01';
  expectedString[6] = '*';
  expectedString[7] = -1;
  local_20 = 0x4132203130203030;
  builtin_strncpy(expectedString," FF",4);
  unique0x100002d8 = this;
  pUVar1 = UtestShell::getCurrent();
  StringFromBinary((uchar *)&local_30,(size_t)(expectedString + 4));
  pcVar2 = SimpleString::asCharString(&local_30);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,&local_20,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x43f,pTVar3);
  SimpleString::~SimpleString(&local_30);
  pUVar1 = UtestShell::getCurrent();
  StringFromBinaryOrNull((uchar *)local_50,(size_t)(expectedString + 4));
  pcVar2 = SimpleString::asCharString(local_50);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,&local_20,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x440,pTVar3);
  SimpleString::~SimpleString(local_50);
  pUVar1 = UtestShell::getCurrent();
  StringFromBinary((uchar *)&local_60,(size_t)(expectedString + 4));
  pcVar2 = SimpleString::asCharString(&local_60);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x441,pTVar3);
  SimpleString::~SimpleString(&local_60);
  pUVar1 = UtestShell::getCurrent();
  StringFromBinaryOrNull((uchar *)&local_70,0);
  pcVar2 = SimpleString::asCharString(&local_70);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"(null)",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x442,pTVar3);
  SimpleString::~SimpleString(&local_70);
  return;
}

Assistant:

TEST(SimpleString, Binary)
{
    const unsigned char value[] = { 0x00, 0x01, 0x2A, 0xFF };
    const char expectedString[] = "00 01 2A FF";

    STRCMP_EQUAL(expectedString, StringFromBinary(value, sizeof(value)).asCharString());
    STRCMP_EQUAL(expectedString, StringFromBinaryOrNull(value, sizeof(value)).asCharString());
    STRCMP_EQUAL("", StringFromBinary(value, 0).asCharString());
    STRCMP_EQUAL("(null)", StringFromBinaryOrNull(NULLPTR, 0).asCharString());
}